

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O0

uint32_t * add_cigar(uint32_t *new_cigar,int32_t *p,int32_t *s,uint32_t length,char op)

{
  int iVar1;
  uint32_t uVar2;
  char op_local;
  uint32_t length_local;
  int32_t *s_local;
  int32_t *p_local;
  uint32_t *new_cigar_local;
  
  p_local = (int32_t *)new_cigar;
  if (*s <= *p) {
    *s = *s + 1;
    *s = *s + -1;
    *s = *s >> 1 | *s;
    *s = *s >> 2 | *s;
    *s = *s >> 4 | *s;
    *s = *s >> 8 | *s;
    *s = *s >> 0x10 | *s;
    *s = *s + 1;
    p_local = (int32_t *)realloc(new_cigar,(long)*s << 2);
  }
  uVar2 = to_cigar_int(length,op);
  iVar1 = *p;
  *p = iVar1 + 1;
  p_local[iVar1] = uVar2;
  return (uint32_t *)p_local;
}

Assistant:

uint32_t* add_cigar (uint32_t* new_cigar, int32_t* p, int32_t* s, uint32_t length, char op) {
	if ((*p) >= (*s)) {
		++(*s);
		kroundup32(*s);
		new_cigar = (uint32_t*)realloc(new_cigar, (*s)*sizeof(uint32_t));
	}
	new_cigar[(*p) ++] = to_cigar_int(length, op);
	return new_cigar;
}